

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O0

MtrNode * Mtr_ReadGroups(FILE *fp,int nleaves)

{
  int iVar1;
  MtrNode *root_00;
  size_t sVar2;
  char **local_70;
  char *c;
  char attrib [33];
  MtrNode *node;
  MtrNode *root;
  uint flags;
  int err;
  int size;
  int low;
  int nleaves_local;
  FILE *fp_local;
  
  size = nleaves;
  _low = (FILE *)fp;
  root_00 = Mtr_InitGroupTree(0,nleaves);
  if (root_00 != (MtrNode *)0x0) {
    do {
      iVar1 = feof(_low);
      if (iVar1 != 0) {
        return root_00;
      }
      iVar1 = __isoc99_fscanf(_low,"%d %d %s",&err,&flags,&c);
      if (iVar1 == -1) {
        return root_00;
      }
      if (iVar1 != 3) {
        Mtr_FreeTree(root_00);
        return (MtrNode *)0x0;
      }
      if (((err < 0) || (size < (int)(err + flags))) || ((int)flags < 1)) {
        Mtr_FreeTree(root_00);
        return (MtrNode *)0x0;
      }
      sVar2 = strlen((char *)&c);
      if (0x20 < sVar2) {
        Mtr_FreeTree(root_00);
        return (MtrNode *)0x0;
      }
      root._4_4_ = 0;
      for (local_70 = &c; *(char *)local_70 != '\0'; local_70 = (char **)((long)local_70 + 1)) {
        switch(*(char *)local_70) {
        case 'D':
          break;
        default:
          return (MtrNode *)0x0;
        case 'F':
          root._4_4_ = root._4_4_ | 4;
          break;
        case 'N':
          root._4_4_ = root._4_4_ | 8;
          break;
        case 'S':
          root._4_4_ = root._4_4_ | 2;
          break;
        case 'T':
          root._4_4_ = root._4_4_ | 1;
        }
      }
      register0x00000000 = Mtr_MakeGroup(root_00,err,flags,root._4_4_);
    } while (register0x00000000 != (MtrNode *)0x0);
    Mtr_FreeTree(root_00);
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Mtr_ReadGroups(
  FILE * fp /* file pointer */,
  int  nleaves /* number of leaves of the new tree */)
{
    int low;
    int size;
    int err;
    unsigned int flags;
    MtrNode *root;
    MtrNode *node;
    char attrib[8*sizeof(unsigned int)+1];
    char *c;

    root = Mtr_InitGroupTree(0,nleaves);
    if (root == NULL) return NULL;

    while (! feof(fp)) {
        /* Read a triple and check for consistency. */
        err = fscanf(fp, "%d %d %s", &low, &size, attrib);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            Mtr_FreeTree(root);
            return(NULL);
        } else if (low < 0 || low+size > nleaves || size < 1) {
            Mtr_FreeTree(root);
            return(NULL);
        } else if (strlen(attrib) > 8 * sizeof(MtrHalfWord)) {
            /* Not enough bits in the flags word to store these many
            ** attributes. */
            Mtr_FreeTree(root);
            return(NULL);
        }

        /* Parse the flag string. Currently all flags are permitted,
        ** to make debugging easier. Normally, specifying NEWNODE
        ** wouldn't be allowed. */
        flags = MTR_DEFAULT;
        for (c=attrib; *c != 0; c++) {
            switch (*c) {
            case 'D':
                break;
            case 'F':
                flags |= MTR_FIXED;
                break;
            case 'N':
                flags |= MTR_NEWNODE;
                break;
            case 'S':
                flags |= MTR_SOFT;
                break;
            case 'T':
                flags |= MTR_TERMINAL;
                break;
            default:
                return NULL;
            }
        }
        node = Mtr_MakeGroup(root, (MtrHalfWord) low, (MtrHalfWord) size,
                             flags);
        if (node == NULL) {
            Mtr_FreeTree(root);
            return(NULL);
        }
    }

    return(root);

}